

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O0

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::Base>
          (Structure *this,Base *dest,FileDatabase *db)

{
  bool bVar1;
  element_type *peVar2;
  pair<Assimp::Blender::Base_*,_int> pVar3;
  int local_74;
  element_type *local_70;
  pair<Assimp::Blender::Base_*,_int> local_68;
  Base *local_58;
  Base *cur_dest;
  int local_48;
  Base *local_40;
  undefined1 local_38 [8];
  pair<Assimp::Blender::Base_*,_int> todo;
  int initial_pos;
  FileDatabase *db_local;
  Base *dest_local;
  Structure *this_local;
  
  peVar2 = ::std::
           __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&db->reader);
  todo._12_4_ = StreamReader<true,_true>::GetCurrentPos(peVar2);
  local_40 = dest;
  pVar3 = ::std::make_pair<Assimp::Blender::Base*,int_const&>(&local_40,(int *)&todo.field_0xc);
  cur_dest = pVar3.first;
  local_48 = pVar3.second;
  local_38 = (undefined1  [8])cur_dest;
  todo.first._0_4_ = local_48;
  while( true ) {
    local_58 = (Base *)local_38;
    peVar2 = ::std::
             __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&db->reader);
    StreamReader<true,_true>::SetCurrentPos(peVar2,(long)(int)todo.first);
    local_58->prev = (Base *)0x0;
    ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Object>
              (this,&local_58->object,"*object",db,false);
    bVar1 = ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Base>
                      (this,&local_58->next,"*next",db,true);
    if ((bVar1) ||
       (bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_58->next), !bVar1)
       ) break;
    local_70 = ::std::
               __shared_ptr_access<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_58->next);
    peVar2 = ::std::
             __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&db->reader);
    local_74 = StreamReader<true,_true>::GetCurrentPos(peVar2);
    pVar3 = ::std::make_pair<Assimp::Blender::Base*,int>(&local_70,&local_74);
    local_68.first = pVar3.first;
    local_68.second = pVar3.second;
    ::std::pair<Assimp::Blender::Base_*,_int>::operator=
              ((pair<Assimp::Blender::Base_*,_int> *)local_38,&local_68);
  }
  peVar2 = ::std::
           __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&db->reader);
  StreamReader<true,_true>::SetCurrentPos(peVar2,(long)(int)todo._12_4_ + this->size);
  return;
}

Assistant:

void Structure :: Convert<Base> (
    Base& dest,
    const FileDatabase& db
    ) const
{
    // note: as per https://github.com/assimp/assimp/issues/128,
    // reading the Object linked list recursively is prone to stack overflow.
    // This structure converter is therefore an hand-written exception that
    // does it iteratively.

    const int initial_pos = db.reader->GetCurrentPos();

    std::pair<Base*, int> todo = std::make_pair(&dest, initial_pos);
    for ( ;; ) {

        Base& cur_dest = *todo.first;
        db.reader->SetCurrentPos(todo.second);

        // we know that this is a double-linked, circular list which we never
        // traverse backwards, so don't bother resolving the back links.
        cur_dest.prev = NULL;

        ReadFieldPtr<ErrorPolicy_Warn>(cur_dest.object,"*object",db);

        // the return value of ReadFieldPtr indicates whether the object
        // was already cached. In this case, we don't need to resolve
        // it again.
        if(!ReadFieldPtr<ErrorPolicy_Warn>(cur_dest.next,"*next",db, true) && cur_dest.next) {
            todo = std::make_pair(&*cur_dest.next, db.reader->GetCurrentPos());
            continue;
        }
        break;
    }

    db.reader->SetCurrentPos(initial_pos + size);
}